

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int ftp_open(char *filename,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  uint uVar4;
  int opt;
  int *sock_00;
  FILE *pFVar5;
  char *pcVar6;
  int sock;
  FILE *command;
  FILE *ftpfile;
  char errorstr [1200];
  int local_4fc;
  FILE *local_4f8;
  FILE *local_4f0;
  char local_4e8 [1208];
  
  closememfile = 0;
  closecommandfile = 0;
  closeftpfile = 0;
  if (rwmode == 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)env);
    if (iVar1 == 0) {
      signal(0xe,signal_handler);
      sVar2 = strlen(filename);
      if (sVar2 < 0x4ad) {
        alarm(net_timeout);
        sock_00 = &local_4fc;
        iVar1 = ftp_open_network(filename,(FILE **)&local_4f0,(FILE **)&local_4f8,sock_00);
        opt = (int)sock_00;
        if (iVar1 == 0) {
          closeftpfile = closeftpfile + 1;
          closecommandfile = closecommandfile + 1;
          iVar1 = mem_create(filename,handle);
          __stream = local_4f0;
          if (iVar1 == 0) {
            closememfile = closememfile + 1;
            uVar4 = fgetc(local_4f0);
            ungetc((int)(char)uVar4,__stream);
            pcVar6 = strstr(filename,".gz");
            if (((pcVar6 == (char *)0x0) && (pcVar6 = strstr(filename,".Z"), (uVar4 & 0xff) != 0x1f)
                ) && (pcVar6 == (char *)0x0)) {
              alarm(net_timeout);
              pFVar5 = __stream;
              sVar2 = fread(local_4e8,1,0x4b0,__stream);
              opt = (int)pFVar5;
              if (sVar2 != 0) {
                do {
                  alarm(0);
                  iVar1 = mem_write(*handle,local_4e8,sVar2);
                  if (iVar1 != 0) {
                    pcVar6 = "Error writing memory file (http_open)";
                    goto LAB_00136270;
                  }
                  alarm(net_timeout);
                  pFVar5 = __stream;
                  sVar2 = fread(local_4e8,1,0x4b0,__stream);
                  opt = (int)pFVar5;
                } while (sVar2 != 0);
              }
LAB_001363c3:
              fclose(__stream);
              closeftpfile = closeftpfile + -1;
              fclose(local_4f8);
              NET_SendRaw(local_4fc,"QUIT\r\n",6,opt);
              closecommandfile = closecommandfile + -1;
              signal(0xe,(__sighandler_t)0x0);
              alarm(0);
              iVar1 = mem_seek(*handle,0);
              return iVar1;
            }
            alarm(net_timeout * 10);
            iVar1 = mem_uncompress2mem(filename,(FILE *)__stream,*handle);
            alarm(0);
            if (iVar1 == 0) goto LAB_001363c3;
            pcVar6 = "Error writing compressed memory file (ftp_open)";
          }
          else {
            pcVar6 = "Could not create memory file to passive port (ftp_open)";
          }
        }
        else {
          alarm(0);
          pcVar6 = "Unable to open following ftp file (ftp_open):";
        }
      }
      else {
        pcVar6 = "filename too long (ftp_open)";
      }
LAB_00136270:
      ffpmsg(pcVar6);
    }
    else {
      ffpmsg("Timeout (ftp_open)");
      snprintf(local_4e8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
      ffpmsg(local_4e8);
      ffpmsg("   (multiplied x10 for files requiring uncompression)");
      filename = "   Timeout may be adjusted with fits_set_timeout";
    }
    ffpmsg(filename);
    alarm(0);
    if ((closecommandfile != 0) && (fclose(local_4f8), -1 < local_4fc)) {
      uVar4 = 0;
      do {
        sVar3 = send(local_4fc,"QUIT\r\n" + uVar4,(long)(int)(6 - uVar4),0);
        if ((int)sVar3 < 1) break;
        uVar4 = uVar4 + (int)sVar3;
      } while ((int)uVar4 < 6);
    }
    if (closeftpfile != 0) {
      fclose(local_4f0);
    }
    if (closememfile != 0) {
      mem_close_free(*handle);
    }
    signal(0xe,(__sighandler_t)0x0);
  }
  else {
    ffpmsg("Can\'t open ftp:// type file with READWRITE access");
    ffpmsg("Specify an outfile for r/w access (ftp_open)");
  }
  return 0x68;
}

Assistant:

int ftp_open(char *filename, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  int sock;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int status;
  char firstchar;

  closememfile = 0;
  closecommandfile = 0;
  closeftpfile = 0;

  /* don't do r/w files */
  if (rwmode != 0) {
    ffpmsg("Can't open ftp:// type file with READWRITE access");
    ffpmsg("Specify an outfile for r/w access (ftp_open)");
    return (FILE_NOT_OPENED);
  }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the ftp connetion.  ftpfile is connected to the file port, 
     command is connected to port 21.  sock is the socket on port 21 */

  if (strlen(filename) > MAXLEN - 4) {
      ffpmsg("filename too long (ftp_open)");
      ffpmsg(filename);
      goto error;
  } 

  alarm(net_timeout);
  if (ftp_open_network(filename,&ftpfile,&command,&sock)) {

      alarm(0);
      ffpmsg("Unable to open following ftp file (ftp_open):");
      ffpmsg(filename);
      goto error;
  } 

  closeftpfile++;
  closecommandfile++;

  /* create the memory file */
  if ((status = mem_create(filename,handle))) {
    ffpmsg ("Could not create memory file to passive port (ftp_open)");
    ffpmsg(filename);
    goto error;
  }
  closememfile++;
  /* This isn't quite right, it'll fail if the file has .gzabc at the end
     for instance */

  /* Decide if the file is compressed */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(filename,".gz") || 
      strstr(filename,".Z") ||
      ('\037' == firstchar)) {
    
    status = 0;
    /* A bit arbritary really, the user will probably hit ^C */
    alarm(net_timeout*10);
    status = mem_uncompress2mem(filename, ftpfile, *handle);
    alarm(0);
    if (status) {
      ffpmsg("Error writing compressed memory file (ftp_open)");
      ffpmsg(filename);
      goto error;
    }
  } else {
    /* write a memory file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = mem_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing memory file (http_open)");
        ffpmsg(filename);
	goto error;
      }
      alarm(net_timeout);
    }
  }

  /* close and clean up */
  fclose(ftpfile);
  closeftpfile--;

  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  closecommandfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}